

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O3

void __thiscall my_algorithm::SymbolPairChecker::SymbolPairChecker(SymbolPairChecker *this)

{
  ListNode<char> *pLVar1;
  long *plVar2;
  undefined8 *puVar3;
  ListNode<char> *pLVar4;
  ListNode<char> *temp_node;
  size_t sVar5;
  long *plVar6;
  long *plVar7;
  long **local_98;
  undefined **local_90;
  long *local_88;
  long *local_80;
  long local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  string *local_58;
  undefined **local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  
  this->_vptr_SymbolPairChecker = (_func_int **)&PTR__SymbolPairChecker_0010ccf8;
  local_68 = &(this->_open_symbols).field_2;
  (this->_open_symbols)._M_dataplus._M_p = (pointer)local_68;
  (this->_open_symbols)._M_string_length = 0;
  (this->_open_symbols).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->_close_symbols).field_2;
  (this->_close_symbols)._M_dataplus._M_p = (pointer)local_70;
  (this->_close_symbols)._M_string_length = 0;
  (this->_close_symbols).field_2._M_local_buf[0] = '\0';
  (this->_stack)._vptr_Stack = (_func_int **)&PTR__Stack_0010cd28;
  (this->_stack)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cd58;
  local_60 = &this->_close_symbols;
  local_58 = &this->_open_symbols;
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cd88;
  pLVar1->_next = (ListNode<char> *)0x0;
  pLVar1->element = '\0';
  (this->_stack)._list._header = pLVar1;
  (this->_stack)._list._tail = pLVar1;
  (this->_stack)._list._size = 0;
  local_98 = (long **)&PTR__LinkedList_0010cd58;
  plVar2 = (long *)operator_new(0x18);
  *plVar2 = (long)&PTR__ListNode_0010cd88;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_80 = (long *)0x0;
  local_90 = (undefined **)plVar2;
  local_88 = plVar2;
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cd88;
  pLVar1->_next = (ListNode<char> *)0x0;
  pLVar1->element = '\0';
  (this->_stack)._list._header = pLVar1;
  (this->_stack)._list._tail = pLVar1;
  (this->_stack)._list._size = 0;
  operator_delete(plVar2,0x18);
  this->_cursor = 0;
  local_90 = (undefined **)0x0;
  local_88 = (long *)((ulong)local_88 & 0xffffffffffffff00);
  local_98 = &local_88;
  std::__cxx11::string::operator=((string *)&this->_open_symbols,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,(long)local_88 + 1);
  }
  local_90 = (undefined **)0x0;
  local_88 = (long *)((ulong)local_88 & 0xffffffffffffff00);
  local_98 = &local_88;
  std::__cxx11::string::operator=((string *)&this->_close_symbols,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,(long)local_88 + 1);
  }
  local_98 = (long **)&PTR__Stack_0010cd28;
  local_90 = &PTR__LinkedList_0010cd58;
  local_88 = (long *)operator_new(0x18);
  *local_88 = (long)&PTR__ListNode_0010cd88;
  local_88[1] = 0;
  *(undefined1 *)(local_88 + 2) = 0;
  local_78 = 0;
  local_50 = &PTR__LinkedList_0010cd58;
  local_80 = local_88;
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = &PTR__ListNode_0010cd88;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_38 = 0;
  local_48 = puVar3;
  local_40 = puVar3;
  local_88 = (long *)operator_new(0x18);
  *local_88 = (long)&PTR__ListNode_0010cd88;
  local_88[1] = 0;
  *(undefined1 *)(local_88 + 2) = 0;
  local_78 = 0;
  local_80 = local_88;
  operator_delete(puVar3,0x18);
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  plVar7 = local_80;
  plVar2 = local_88;
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cd88;
  pLVar1->_next = (ListNode<char> *)0x0;
  pLVar1->element = '\0';
  (this->_stack)._list._header = pLVar1;
  (this->_stack)._list._tail = pLVar1;
  (this->_stack)._list._size = 0;
  if (local_80 == local_88) {
    local_98 = (long **)&PTR__Stack_0010cd28;
    local_90 = &PTR__LinkedList_0010cd58;
  }
  else {
    sVar5 = 1;
    plVar6 = local_88;
    do {
      plVar6 = (long *)plVar6[1];
      pLVar4 = (ListNode<char> *)operator_new(0x18);
      pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cd88;
      pLVar4->element = (char)plVar6[2];
      pLVar4->_next = pLVar1->_next;
      pLVar1->_next = pLVar4;
      (this->_stack)._list._size = sVar5;
      (this->_stack)._list._tail = pLVar4;
      sVar5 = sVar5 + 1;
      pLVar1 = pLVar4;
    } while (plVar7 != plVar6);
    local_98 = (long **)&PTR__Stack_0010cd28;
    local_90 = &PTR__LinkedList_0010cd58;
    do {
      plVar6 = (long *)plVar2[1];
      if (plVar6 != (long *)0x0) {
        plVar2[1] = plVar6[1];
        (**(code **)(*plVar6 + 8))(plVar6);
        plVar7 = local_80;
      }
      if (plVar6 == plVar7) {
        plVar7 = plVar2;
        local_80 = plVar2;
      }
      local_78 = local_78 + -1;
      plVar2 = local_88;
    } while (local_88 != plVar7);
  }
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 8))(local_88);
  }
  return;
}

Assistant:

SymbolPairChecker::SymbolPairChecker() {
        _cursor = 0;
        _open_symbols = std::string();
        _close_symbols = std::string();
        _stack = data_structures::Stack<char>();
    }